

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O0

ssize_t __thiscall dtc::dtb::string_table::write(string_table *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  allocator<char> local_b9;
  string local_b8 [32];
  reference local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  long *local_18;
  output_writer *writer_local;
  string_table *this_local;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  local_18 = plVar3;
  writer_local = (output_writer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"Strings table.",&local_39);
  (**(code **)(*plVar3 + 8))(plVar3,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  plVar3 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"dt_strings_start",(allocator<char> *)((long)&__range2 + 7));
  (**(code **)*plVar3)(plVar3,local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->strings);
  i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->strings);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    plVar3 = local_18;
    if (!bVar1) break;
    local_98 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    (**(code **)(*local_18 + 0x10))(local_18,local_98);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"dt_strings_end",&local_b9);
  (**(code **)*plVar3)(plVar3,local_b8);
  std::__cxx11::string::~string(local_b8);
  sVar2 = std::allocator<char>::~allocator(&local_b9);
  return sVar2;
}

Assistant:

void
string_table::write(dtb::output_writer &writer)
{
	writer.write_comment("Strings table.");
	writer.write_label("dt_strings_start");
	for (auto &i : strings)
	{
		writer.write_string(i);
	}
	writer.write_label("dt_strings_end");
}